

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

Am_Object Am_Find_Part_Place(Am_Object *obj,Am_Object *group)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *in_RDX;
  Am_Object *prev;
  Am_Value_List group_parts;
  Am_Object part;
  Am_Value_List local_40;
  Am_Object local_30;
  
  Am_Value_List::Am_Value_List(&local_40);
  pAVar2 = Am_Object::Get(in_RDX,0x82,0);
  Am_Value_List::operator=(&local_40,pAVar2);
  local_30.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&local_40);
  do {
    bVar1 = Am_Value_List::Last(&local_40);
    prev = &Am_No_Object;
    if (bVar1) {
LAB_00238e44:
      Am_Object::Am_Object(obj,prev);
      Am_Object::~Am_Object(&local_30);
      Am_Value_List::~Am_Value_List(&local_40);
      return (Am_Object)(Am_Object_Data *)obj;
    }
    pAVar2 = Am_Value_List::Get(&local_40);
    Am_Object::operator=(&local_30,pAVar2);
    bVar1 = Am_Object::operator==(&local_30,group);
    if (bVar1) {
      Am_Value_List::Next(&local_40);
      bVar1 = Am_Value_List::Last(&local_40);
      if (!bVar1) {
        pAVar2 = Am_Value_List::Get(&local_40);
        Am_Object::operator=(&local_30,pAVar2);
        prev = &local_30;
      }
      goto LAB_00238e44;
    }
    Am_Value_List::Next(&local_40);
  } while( true );
}

Assistant:

Am_Object
Am_Find_Part_Place(Am_Object obj, Am_Object group)
{
  Am_Value_List group_parts;
  group_parts = group.Get(Am_GRAPHICAL_PARTS);
  Am_Object part;
  for (group_parts.Start(); !group_parts.Last(); group_parts.Next()) {
    part = group_parts.Get();
    if (part == obj) {
      group_parts.Next();
      if (group_parts.Last())
        return Am_No_Object;
      else {
        part = group_parts.Get();
        return part;
      }
    }
  }
  return Am_No_Object;
}